

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O2

vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
* tinyusdz::tydra::GetBlendShapes
            (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
             *__return_storage_ptr__,Stage *stage,Prim *prim,string *err)

{
  bool bVar1;
  GeomMesh *pGVar2;
  value_type *pvVar3;
  BlendShape *pBVar4;
  string *args;
  long lVar5;
  char *pcVar6;
  optional<tinyusdz::Relationship> *this;
  pointer ppVar7;
  Path *path;
  Prim *bsprim;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> blendShapeNames;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
  dst;
  allocator local_f1;
  Prim *local_f0;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_e8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
  local_c8;
  string *local_b0;
  pointer local_a8;
  pointer ppStack_a0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>
  local_98;
  string local_70;
  string local_50 [32];
  
  local_a8 = (pointer)0x0;
  ppStack_a0 = (pointer)0x0;
  local_c8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pGVar2 = Prim::as<tinyusdz::GeomMesh>(prim);
  if (pGVar2 == (GeomMesh *)0x0) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::append((char *)err);
    }
    (__return_storage_ptr__->
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    goto LAB_00279ce9;
  }
  bVar1 = TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>::authored
                    (&pGVar2->blendShapes);
  if ((!bVar1) || ((pGVar2->blendShapeTargets).has_value_ != true)) {
    local_c8.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_00279b2e:
    (__return_storage_ptr__->
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
    )._M_impl.super__Vector_impl_data._M_start = local_a8;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = ppStack_a0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_c8.
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_c8.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    goto LAB_00279ce9;
  }
  local_e8.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>::get_value
                    (&pGVar2->blendShapes,&local_e8);
  if (bVar1) {
    this = &pGVar2->blendShapeTargets;
    pvVar3 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value(this);
    if (pvVar3->type == Path) {
      if ((long)local_e8.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_e8.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                _M_impl.super__Vector_impl_data._M_start != 0x20) goto joined_r0x00279cc3;
      pvVar3 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value(this);
      path = &pvVar3->targetPath;
      local_f0 = (Prim *)0x0;
      args = err;
      bVar1 = Stage::find_prim_at_path(stage,path,&local_f0,err);
      if (bVar1) {
        if (local_f0 == (Prim *)0x0) goto joined_r0x00279cc3;
        pBVar4 = Prim::as<tinyusdz::BlendShape>(local_f0);
        if (pBVar4 != (BlendShape *)0x0) {
          ::std::__cxx11::string::string
                    ((string *)&local_98,
                     (string *)
                     local_e8.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                     _M_impl.super__Vector_impl_data._M_start);
          local_98.second = pBVar4;
          ::std::
          vector<std::pair<std::__cxx11::string,tinyusdz::BlendShape_const*>,std::allocator<std::pair<std::__cxx11::string,tinyusdz::BlendShape_const*>>>
          ::emplace_back<std::pair<std::__cxx11::string,tinyusdz::BlendShape_const*>>
                    ((vector<std::pair<std::__cxx11::string,tinyusdz::BlendShape_const*>,std::allocator<std::pair<std::__cxx11::string,tinyusdz::BlendShape_const*>>>
                      *)&local_c8,&local_98);
          ::std::__cxx11::string::_M_dispose();
          goto LAB_00279bd1;
        }
        if (err != (string *)0x0) {
          pcVar6 = "{} is not BlendShape Prim.\n";
LAB_00279d65:
          ::std::__cxx11::string::string(local_50,pcVar6,&local_f1);
          Path::full_path_name_abi_cxx11_(&local_70,path);
          fmt::format<std::__cxx11::string>
                    ((string *)&local_98,(fmt *)local_50,(string *)&local_70,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
          ::std::__cxx11::string::append((string *)err);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
      }
    }
    else {
      pvVar3 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value(this);
      if ((pvVar3->type == PathVector) &&
         (lVar5 = (long)local_e8.
                        super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_e8.
                        super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                        _M_impl.super__Vector_impl_data._M_start,
         pvVar3 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value(this),
         lVar5 >> 5 ==
         ((long)(pvVar3->targetPathVector).
                super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                super__Vector_impl_data._M_finish -
         (long)(pvVar3->targetPathVector).
               super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
               super__Vector_impl_data._M_start) / 0xd0)) {
LAB_00279bd1:
        lVar5 = 0;
        ppVar7 = (pointer)0x0;
        local_b0 = err;
        while (err = local_b0,
              pvVar3 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value(this),
              ppVar7 < (pointer)(((long)(pvVar3->targetPathVector).
                                        super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pvVar3->targetPathVector).
                                       super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                       ._M_impl.super__Vector_impl_data._M_start) / 0xd0)) {
          local_a8 = ppVar7;
          pvVar3 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value(this);
          path = (Path *)((long)&(((pvVar3->targetPathVector).
                                   super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_prim_part).
                                 _M_dataplus._M_p + lVar5);
          local_f0 = (Prim *)0x0;
          args = err;
          bVar1 = Stage::find_prim_at_path(stage,path,&local_f0,err);
          if (!bVar1) goto LAB_00279cd4;
          if (local_f0 == (Prim *)0x0) {
            if (err == (string *)0x0) goto LAB_00279cd4;
            goto LAB_00279ccc;
          }
          pBVar4 = Prim::as<tinyusdz::BlendShape>(local_f0);
          if (pBVar4 == (BlendShape *)0x0) {
            if (local_b0 == (string *)0x0) goto LAB_00279cd4;
            pcVar6 = "{} is not BlendShape Prim.";
            err = local_b0;
            goto LAB_00279d65;
          }
          ::std::__cxx11::string::string
                    ((string *)&local_98,
                     (string *)
                     local_e8.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                     _M_impl.super__Vector_impl_data._M_start);
          local_98.second = pBVar4;
          ::std::
          vector<std::pair<std::__cxx11::string,tinyusdz::BlendShape_const*>,std::allocator<std::pair<std::__cxx11::string,tinyusdz::BlendShape_const*>>>
          ::emplace_back<std::pair<std::__cxx11::string,tinyusdz::BlendShape_const*>>
                    ((vector<std::pair<std::__cxx11::string,tinyusdz::BlendShape_const*>,std::allocator<std::pair<std::__cxx11::string,tinyusdz::BlendShape_const*>>>
                      *)&local_c8,&local_98);
          ::std::__cxx11::string::_M_dispose();
          lVar5 = lVar5 + 0xd0;
          ppVar7 = (pointer)((long)&(local_a8->first)._M_dataplus._M_p + 1);
        }
        ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector(&local_e8);
        local_a8 = local_c8.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppStack_a0 = local_c8.
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        goto LAB_00279b2e;
      }
joined_r0x00279cc3:
      if (err != (string *)0x0) goto LAB_00279ccc;
    }
  }
  else {
    if (err == (string *)0x0) goto LAB_00279cd4;
LAB_00279ccc:
    ::std::__cxx11::string::append((char *)err);
  }
LAB_00279cd4:
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector(&local_e8);
LAB_00279ce9:
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
  ::~vector(&local_c8);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<std::string, const tinyusdz::BlendShape *>>
GetBlendShapes(const tinyusdz::Stage &stage, const tinyusdz::Prim &prim,
               std::string *err) {
  std::vector<std::pair<std::string, const tinyusdz::BlendShape *>> dst;

  auto *pmesh = prim.as<GeomMesh>();
  if (!pmesh) {
    if (err) {
      (*err) += "Prim must be GeomMesh.\n";
    }
    return std::vector<std::pair<std::string, const tinyusdz::BlendShape *>>{};
  }

  //
  // BlendShape Prim may not be a child of GeomMesh. So need to search Prim in
  // Stage
  //
  if (pmesh->blendShapes.authored() && pmesh->blendShapeTargets.has_value()) {
    // TODO: connection?
    std::vector<value::token> blendShapeNames;

    if (!pmesh->blendShapes.get_value(&blendShapeNames)) {
      if (err) {
        (*err) += "Failed to get `skel:blendShapes` attribute.\n";
      }
      return std::vector<
          std::pair<std::string, const tinyusdz::BlendShape *>>{};
    }

    if (pmesh->blendShapeTargets.value().is_path()) {
      if (blendShapeNames.size() != 1) {
        if (err) {
          (*err) +=
              "Array size mismatch with `skel:blendShapes` and "
              "`skel:blendShapeTargets`.\n";
        }
        return std::vector<
            std::pair<std::string, const tinyusdz::BlendShape *>>{};
      }

      const Path &targetPath = pmesh->blendShapeTargets.value().targetPath;
      const Prim *bsprim{nullptr};
      if (!stage.find_prim_at_path(targetPath, bsprim, err)) {
        return std::vector<
            std::pair<std::string, const tinyusdz::BlendShape *>>{};
      }
      if (!bsprim) {
        if (err) {
          (*err) += "Internal error. BlendShape Prim is nullptr.\n";
        }
        return std::vector<
            std::pair<std::string, const tinyusdz::BlendShape *>>{};
      }

      if (const auto *bs = bsprim->as<BlendShape>()) {
        dst.push_back(std::make_pair(blendShapeNames[0].str(), bs));
      } else {
        if (err) {
          (*err) += fmt::format("{} is not BlendShape Prim.\n",
                                targetPath.full_path_name());
        }
        return std::vector<
            std::pair<std::string, const tinyusdz::BlendShape *>>{};
      }

    } else if (pmesh->blendShapeTargets.value().is_pathvector()) {
      if (blendShapeNames.size() !=
          pmesh->blendShapeTargets.value().targetPathVector.size()) {
        if (err) {
          (*err) +=
              "Array size mismatch with `skel:blendShapes` and "
              "`skel:blendShapeTargets`.\n";
        }
        return std::vector<
            std::pair<std::string, const tinyusdz::BlendShape *>>{};
      }
    } else {
      if (err) {
        (*err) +=
            "Invalid or unsupported definition of `skel:blendShapeTargets` "
            "relationship.\n";
      }
      return std::vector<
          std::pair<std::string, const tinyusdz::BlendShape *>>{};
    }

    for (size_t i = 0;
         i < pmesh->blendShapeTargets.value().targetPathVector.size(); i++) {
      const Path &targetPath =
          pmesh->blendShapeTargets.value().targetPathVector[i];
      const Prim *bsprim{nullptr};
      if (!stage.find_prim_at_path(targetPath, bsprim, err)) {
        return std::vector<
            std::pair<std::string, const tinyusdz::BlendShape *>>{};
      }
      if (!bsprim) {
        if (err) {
          (*err) += "Internal error. BlendShape Prim is nullptr.";
        }
        return std::vector<
            std::pair<std::string, const tinyusdz::BlendShape *>>{};
      }

      if (const auto *bs = bsprim->as<BlendShape>()) {
        dst.push_back(std::make_pair(blendShapeNames[0].str(), bs));
      } else {
        if (err) {
          (*err) += fmt::format("{} is not BlendShape Prim.",
                                targetPath.full_path_name());
        }
        return std::vector<
            std::pair<std::string, const tinyusdz::BlendShape *>>{};
      }
    }
  }

  return dst;
}